

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase355::run(TestCase355 *this)

{
  Builder builder_00;
  bool bVar1;
  undefined6 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  bool local_1a9;
  undefined1 auStack_1a8 [7];
  bool _kj_shouldLog;
  size_t local_1a0;
  ArrayPtr<const_capnp::word> local_198;
  bool local_182;
  DebugExpression<bool> local_181;
  undefined1 local_180 [7];
  DebugExpression<bool> _kjCondition;
  TestOutputStream output;
  Array<capnp::word> serialized;
  Builder local_130;
  undefined1 local_108 [8];
  TestMessageBuilder builder;
  TestCase355 *this_local;
  
  builder._240_8_ = this;
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_108,7);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_130,(MessageBuilder *)local_108);
  builder_00._builder.capTable = (CapTableBuilder *)local_130._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_130._builder.capTable;
  builder_00._builder.data = local_130._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_130._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffe20;
  builder_00._builder.pointerCount = (short)((uint6)in_stack_fffffffffffffe20 >> 0x20);
  builder_00._builder._38_1_ = in_stack_fffffffffffffe26;
  builder_00._builder._39_1_ = in_stack_fffffffffffffe27;
  initTestMessage(builder_00);
  messageToFlatArray((Array<capnp::word> *)((long)&output.data.field_2 + 8),
                     (MessageBuilder *)local_108);
  TestOutputStream::TestOutputStream((TestOutputStream *)local_180);
  writeMessage((OutputStream *)local_180,(MessageBuilder *)local_108);
  _auStack_1a8 = kj::Array<capnp::word>::asPtr
                           ((Array<capnp::word> *)((long)&output.data.field_2 + 8));
  local_198 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)auStack_1a8);
  local_182 = TestOutputStream::dataEquals((TestOutputStream *)local_180,local_198);
  local_181 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_182);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_181);
  if (!bVar1) {
    local_1a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a9 != false) {
      kj::_::Debug::log<char_const(&)[55],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-test.c++"
                 ,0x16c,ERROR,
                 "\"failed: expected \" \"output.dataEquals(serialized.asPtr())\", _kjCondition",
                 (char (*) [55])"failed: expected output.dataEquals(serialized.asPtr())",&local_181)
      ;
      local_1a9 = false;
    }
  }
  TestOutputStream::~TestOutputStream((TestOutputStream *)local_180);
  kj::Array<capnp::word>::~Array((Array<capnp::word> *)((long)&output.data.field_2 + 8));
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_108);
  return;
}

Assistant:

TEST(Serialize, WriteMessageOddSegmentCount) {
  TestMessageBuilder builder(7);
  initTestMessage(builder.initRoot<TestAllTypes>());

  kj::Array<word> serialized = messageToFlatArray(builder);

  TestOutputStream output;
  writeMessage(output, builder);

  EXPECT_TRUE(output.dataEquals(serialized.asPtr()));
}